

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O0

void __thiscall
QPixmap::QPixmap(QPixmap *this,QString *fileName,char *format,ImageConversionFlags flags)

{
  bool bVar1;
  undefined8 in_RDX;
  QPixmap *in_RSI;
  QPaintDevice *in_RDI;
  long in_FS_OFFSET;
  QString *unaff_retaddr;
  QPixmap *in_stack_00000008;
  ImageConversionFlags in_stack_000000e4;
  char *format_00;
  
  format_00 = *(char **)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(in_RDI);
  in_RDI->_vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_00e14ce8;
  QExplicitlySharedDataPointer<QPlatformPixmap>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QPlatformPixmap> *)0x320394);
  doInit(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)in_RDI >> 0x20));
  bVar1 = qt_pixmap_thread_test();
  if (bVar1) {
    load(in_stack_00000008,unaff_retaddr,format_00,in_stack_000000e4);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != format_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QPixmap::QPixmap(const QString& fileName, const char *format, Qt::ImageConversionFlags flags)
    : QPaintDevice()
{
    doInit(0, 0, QPlatformPixmap::PixmapType);
    if (!qt_pixmap_thread_test())
        return;

    load(fileName, format, flags);
}